

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int open_tmp_file(char **out_path,char *ext,uint ext_len)

{
  str_t *psVar1;
  char *__size;
  char *__s;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar2;
  char *pcVar3;
  uint local_58;
  uint suffix_len;
  char *tmp_file_template;
  size_t tmp_file_template_size;
  str_t tmp_dir;
  int fd;
  uint ext_len_local;
  char *ext_local;
  char **out_path_local;
  
  uVar2 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  tmp_dir.size._0_4_ = -1;
  tmp_dir.size._4_4_ = ext_len;
  memset(&tmp_file_template_size,0,0x10);
  if (tmp_dir.size._4_4_ == 0) {
    local_58 = 0;
  }
  else {
    local_58 = tmp_dir.size._4_4_ + 1;
  }
  psVar1 = get_sys_temp_dir((str_t *)&tmp_file_template_size);
  if (psVar1 == (str_t *)0x0) {
    perror("get_sys_temp_dir");
    out_path_local._4_4_ = -1;
  }
  else {
    __size = tmp_dir.name + (ulong)local_58 + 0x14;
    __s = (char *)malloc((size_t)__size);
    if (__s == (char *)0x0) {
      perror("malloc");
    }
    else {
      memset(__s,0,(size_t)__size);
      if (local_58 == 0) {
        snprintf(__s,(size_t)__size,"%.*s%cchrome_bee_XXXXXXXX",(ulong)tmp_dir.name & 0xffffffff,
                 tmp_file_template_size,0x2f);
        tmp_dir.size._0_4_ = mkstemp(__s);
        if ((int)tmp_dir.size == -1) {
          perror("mktemp");
        }
      }
      else {
        pcVar3 = ext;
        snprintf(__s,(size_t)__size,"%.*s%cchrome_bee_XXXXXXXX.%.*s",
                 (ulong)tmp_dir.name & 0xffffffff,tmp_file_template_size,0x2f,
                 CONCAT44(uVar2,tmp_dir.size._4_4_),ext);
        fprintf(_stderr,
                "%s: tmp_file_template = \"%s\" tmp_file_template_size = %lu suffix_len = (%u) ext = (%s) ext_len = %u\n"
                ,"open_tmp_file",__s,__size,(ulong)local_58,ext,
                CONCAT44((int)((ulong)pcVar3 >> 0x20),tmp_dir.size._4_4_));
        tmp_dir.size._0_4_ = mkstemps(__s,local_58);
        if ((int)tmp_dir.size == -1) {
          perror("mktemps");
        }
      }
      *out_path = __s;
    }
    if ((&stack0x00000000 != (undefined1 *)0x40) && (tmp_file_template_size != 0)) {
      free((void *)tmp_file_template_size);
    }
    if (((int)tmp_dir.size == -1) && (__s != (char *)0x0)) {
      free(__s);
    }
    out_path_local._4_4_ = (int)tmp_dir.size;
  }
  return out_path_local._4_4_;
}

Assistant:

int
open_tmp_file (char **out_path, const char* ext, unsigned ext_len)
{
  int fd = -1;
  str_t tmp_dir = { 0 };
  size_t tmp_file_template_size = 0;
  char *tmp_file_template = NULL;
  const unsigned suffix_len = ext_len ? 1 + ext_len : 0;

  if (unlikely (get_sys_temp_dir (&tmp_dir) == NULL))
    {
      perror ("get_sys_temp_dir");
      return -1;
    }

  tmp_file_template_size = (tmp_dir.size - 1) +
    DIR_SEPARATOR_LEN + sizeof (TMP_FILENAME_TEMPLATE) + suffix_len;

  tmp_file_template = malloc (tmp_file_template_size);
  if (unlikely (tmp_file_template == NULL))
    {
      perror ("malloc");
      goto _ret;
    }
  memset (tmp_file_template, 0, tmp_file_template_size);

  if (suffix_len)
    {
      snprintf (tmp_file_template, tmp_file_template_size,
                "%.*s%c" TMP_FILENAME_TEMPLATE ".%.*s",
                (int)tmp_dir.size, tmp_dir.name, DIR_SEPARATOR, ext_len, ext);
      elog_debug ("%s: tmp_file_template = \"%s\" "
                  "tmp_file_template_size = %lu "
                  "suffix_len = (%u) "
                  "ext = (%s) "
                  "ext_len = %u\n",
                 __func__,
                 tmp_file_template,
                 tmp_file_template_size,
                 suffix_len,
                 ext,
                 ext_len);

      fd = mkstemps (tmp_file_template, suffix_len);
      if (fd == -1)
        perror("mktemps");
    }
  else
    {
      snprintf (tmp_file_template, tmp_file_template_size,
                "%.*s%c" TMP_FILENAME_TEMPLATE,
                (int)tmp_dir.size, tmp_dir.name, DIR_SEPARATOR);

      fd = mkstemp (tmp_file_template);
      if (fd == -1)
        perror("mktemp");
    }

  *out_path = tmp_file_template;

_ret:
  str_destroy (&tmp_dir);

  if (fd == -1)
    {
      if (tmp_file_template != NULL)
        free (tmp_file_template);
    }

  return fd;
}